

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

int RemoveClass(PClass *cls)

{
  bool bVar1;
  AActor *this;
  undefined1 local_38 [8];
  TThinkerIterator<AActor> iterator;
  bool player;
  int removecount;
  AActor *actor;
  PClass *cls_local;
  
  iterator.super_FThinkerIterator._20_4_ = 0;
  iterator.super_FThinkerIterator._19_1_ = 0;
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)local_38,cls,0x80);
  while (this = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)local_38),
        this != (AActor *)0x0) {
    bVar1 = DObject::IsA((DObject *)this,cls);
    if (bVar1) {
      if (this->player == (player_t *)0x0) {
        iterator.super_FThinkerIterator._20_4_ = iterator.super_FThinkerIterator._20_4_ + 1;
        AActor::ClearCounters(this);
        (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
      }
      else {
        iterator.super_FThinkerIterator._19_1_ = 1;
      }
    }
  }
  if ((iterator.super_FThinkerIterator._19_1_ & 1) != 0) {
    Printf("Cannot remove live players!\n");
  }
  return iterator.super_FThinkerIterator._20_4_;
}

Assistant:

static int RemoveClass(const PClass *cls)
{
	AActor *actor;
	int removecount = 0;
	bool player = false;
	TThinkerIterator<AActor> iterator(cls);
	while ((actor = iterator.Next()))
	{
		if (actor->IsA(cls))
		{
			// [MC]Do not remove LIVE players.
			if (actor->player != NULL)
			{
				player = true;
				continue;
			}
			removecount++; 
			actor->ClearCounters();
			actor->Destroy();
		}
	}
	if (player)
		Printf("Cannot remove live players!\n");
	return removecount;

}